

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O1

void __thiscall
Args::CmdLine::savePositionalArguments(CmdLine *this,String *word,bool splitted,bool valuePrepended)

{
  pointer pcVar1;
  pointer pbVar2;
  value_type *__x;
  int iVar3;
  pointer pbVar4;
  undefined7 in_register_00000011;
  bool bVar5;
  String tmp;
  value_type local_60;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  pcVar1 = (word->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + word->_M_string_length);
  if ((int)CONCAT71(in_register_00000011,splitted) != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_60._M_string_length,0,'\x01');
    if (valuePrepended) {
      pbVar4 = (this->m_context).m_context.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = (this->m_context).m_it._M_current;
      if (pbVar2 != pbVar4) {
        (this->m_context).m_it._M_current = pbVar2 + 1;
        pbVar4 = pbVar2;
      }
      std::__cxx11::string::_M_append((char *)&local_60,(ulong)(pbVar4->_M_dataplus)._M_p);
    }
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,'\x02');
  bVar5 = true;
  if (local_60._M_string_length == local_38) {
    if (local_60._M_string_length == 0) {
      bVar5 = false;
    }
    else {
      iVar3 = bcmp(local_60._M_dataplus._M_p,local_40,local_60._M_string_length);
      bVar5 = iVar3 != 0;
    }
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (bVar5) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_positional,&local_60);
  }
  while (__x = (this->m_context).m_it._M_current,
        __x != (this->m_context).m_context.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    (this->m_context).m_it._M_current = __x + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_positional,__x);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void savePositionalArguments( const String & word, bool splitted, bool valuePrepended )
	{
		auto tmp = word;

		if( splitted )
		{
			tmp.append( 1, '=' );

			if( valuePrepended )
				tmp.append( *m_context.next() );
		}

		if( tmp != String( 2, '-' ) )
			m_positional.push_back( tmp );

		while( !m_context.atEnd() )
		{
			auto it = m_context.next();

			m_positional.push_back( *it );
		}
	}